

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestHarness_c_count_mallocs_TestShell::createTest
          (TEST_TestHarness_c_count_mallocs_TestShell *this)

{
  TEST_TestHarness_c_count_mallocs_Test *this_00;
  TEST_TestHarness_c_count_mallocs_TestShell *this_local;
  
  this_00 = (TEST_TestHarness_c_count_mallocs_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x2ef);
  TEST_TestHarness_c_count_mallocs_Test::TEST_TestHarness_c_count_mallocs_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, count_mallocs)
{
    cpputest_malloc_count_reset();
    void * m1 = cpputest_malloc(10);
    void * m2 = cpputest_malloc(11);
    void * m3 = cpputest_malloc(12);
    cpputest_free(m1);
    cpputest_free(m2);
    cpputest_free(m3);
    LONGS_EQUAL(3, cpputest_malloc_get_count());
}